

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.hpp
# Opt level: O0

shared_ptr<helics::CoreFactory::CoreBuilder>
helics::CoreFactory::
addCoreType<helics::NetworkCore<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4>>
          (string_view coreTypeName,int code)

{
  string_view name;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::CoreFactory::CoreBuilder> *in_RDI;
  shared_ptr<helics::CoreFactory::CoreBuilder> sVar1;
  shared_ptr<helics::CoreFactory::CoreTypeBuilder<helics::NetworkCore<helics::inproc::InprocComms,_(gmlc::networking::InterfaceTypes)4>_>_>
  bld;
  shared_ptr<helics::CoreFactory::CoreBuilder> *cbld;
  shared_ptr<helics::CoreFactory::CoreBuilder> *this;
  shared_ptr<helics::CoreFactory::CoreBuilder> *__r;
  int in_stack_ffffffffffffffbc;
  shared_ptr<helics::CoreFactory::CoreBuilder> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar2;
  element_type *in_stack_ffffffffffffffd0;
  
  this = (shared_ptr<helics::CoreFactory::CoreBuilder> *)&stack0xffffffffffffffd0;
  __r = in_RDI;
  std::
  make_shared<helics::CoreFactory::CoreTypeBuilder<helics::NetworkCore<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4>>>
            ();
  uVar2 = 0;
  std::
  static_pointer_cast<helics::CoreFactory::CoreBuilder,helics::CoreFactory::CoreTypeBuilder<helics::NetworkCore<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4>>>
            ((shared_ptr<helics::CoreFactory::CoreTypeBuilder<helics::NetworkCore<helics::inproc::InprocComms,_(gmlc::networking::InterfaceTypes)4>_>_>
              *)__r);
  std::shared_ptr<helics::CoreFactory::CoreBuilder>::shared_ptr(this,in_RDI);
  name._M_len._7_1_ = uVar2;
  name._M_len._0_7_ = in_stack_ffffffffffffffc8;
  name._M_str = (char *)in_stack_ffffffffffffffd0;
  defineCoreBuilder(in_stack_ffffffffffffffc0,name,in_stack_ffffffffffffffbc);
  std::shared_ptr<helics::CoreFactory::CoreBuilder>::~shared_ptr
            ((shared_ptr<helics::CoreFactory::CoreBuilder> *)0x46ac8e);
  std::
  shared_ptr<helics::CoreFactory::CoreTypeBuilder<helics::NetworkCore<helics::inproc::InprocComms,_(gmlc::networking::InterfaceTypes)4>_>_>
  ::~shared_ptr((shared_ptr<helics::CoreFactory::CoreTypeBuilder<helics::NetworkCore<helics::inproc::InprocComms,_(gmlc::networking::InterfaceTypes)4>_>_>
                 *)0x46acde);
  sVar1.super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<helics::CoreFactory::CoreBuilder>)
         sVar1.super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CoreBuilder> addCoreType(std::string_view coreTypeName, int code)
    {
        auto bld = std::make_shared<CoreTypeBuilder<CoreTYPE>>();
        std::shared_ptr<CoreBuilder> cbld = std::static_pointer_cast<CoreBuilder>(bld);
        defineCoreBuilder(cbld, coreTypeName, code);
        return cbld;
    }